

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bindexplib.h
# Opt level: O0

void __thiscall bindexplib::bindexplib(bindexplib *this)

{
  bindexplib *this_local;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->Symbols);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->DataSymbols);
  std::__cxx11::string::string((string *)&this->NmPath);
  std::__cxx11::string::operator=((string *)&this->NmPath,"nm");
  return;
}

Assistant:

bindexplib() { NmPath = "nm"; }